

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON_bool parse_object(cJSON *item,parse_buffer *input_buffer)

{
  bool bVar1;
  cJSON_bool cVar2;
  cJSON *item_00;
  ulong uVar3;
  cJSON *item_01;
  cJSON *pcVar4;
  cJSON *local_38;
  
  if (999 < input_buffer->depth) {
    return 0;
  }
  input_buffer->depth = input_buffer->depth + 1;
  uVar3 = input_buffer->offset;
  if ((uVar3 < input_buffer->length) && (input_buffer->content[uVar3] == '{')) {
    input_buffer->offset = uVar3 + 1;
    buffer_skip_whitespace(input_buffer);
    uVar3 = input_buffer->offset;
    if (uVar3 < input_buffer->length) {
      if (input_buffer->content[uVar3] == '}') {
        item_01 = (cJSON *)0x0;
        local_38 = (cJSON *)0x0;
LAB_00104fe5:
        input_buffer->depth = input_buffer->depth - 1;
        if (item_01 != (cJSON *)0x0) {
          item_01->prev = local_38;
        }
        item->type = 0x40;
        item->child = item_01;
        input_buffer->offset = input_buffer->offset + 1;
        return 1;
      }
      if (uVar3 < input_buffer->length) {
        input_buffer->offset = uVar3 - 1;
        local_38 = (cJSON *)0x0;
        pcVar4 = (cJSON *)0x0;
        do {
          item_00 = (cJSON *)(*(input_buffer->hooks).allocate)(0x40);
          if (item_00 == (cJSON *)0x0) {
            bVar1 = false;
            item_01 = pcVar4;
          }
          else {
            item_00->valuedouble = 0.0;
            item_00->string = (char *)0x0;
            item_00->valuestring = (char *)0x0;
            *(undefined8 *)&item_00->valueint = 0;
            item_00->child = (cJSON *)0x0;
            *(undefined8 *)&item_00->type = 0;
            item_00->next = (cJSON *)0x0;
            item_00->prev = (cJSON *)0x0;
            item_01 = item_00;
            if (pcVar4 != (cJSON *)0x0) {
              local_38->next = item_00;
              item_00->prev = local_38;
              item_01 = pcVar4;
            }
            uVar3 = input_buffer->offset + 1;
            local_38 = item_00;
            if (uVar3 < input_buffer->length) {
              input_buffer->offset = uVar3;
              buffer_skip_whitespace(input_buffer);
              cVar2 = parse_string(item_00,input_buffer);
              if (cVar2 != 0) {
                buffer_skip_whitespace(input_buffer);
                item_00->string = item_00->valuestring;
                item_00->valuestring = (char *)0x0;
                uVar3 = input_buffer->offset;
                if ((uVar3 < input_buffer->length) && (input_buffer->content[uVar3] == ':')) {
                  input_buffer->offset = uVar3 + 1;
                  buffer_skip_whitespace(input_buffer);
                  cVar2 = parse_value(item_00,input_buffer);
                  if (cVar2 != 0) {
                    buffer_skip_whitespace(input_buffer);
                    bVar1 = true;
                    goto LAB_001050f6;
                  }
                }
              }
              bVar1 = false;
            }
            else {
              bVar1 = false;
            }
          }
LAB_001050f6:
          if (!bVar1) goto LAB_00105136;
          uVar3 = input_buffer->offset;
          if (input_buffer->length <= uVar3) goto LAB_00105136;
          pcVar4 = item_01;
        } while (input_buffer->content[uVar3] == ',');
        if ((uVar3 < input_buffer->length) && (input_buffer->content[uVar3] == '}'))
        goto LAB_00104fe5;
        goto LAB_00105136;
      }
    }
    input_buffer->offset = uVar3 - 1;
  }
  item_01 = (cJSON *)0x0;
LAB_00105136:
  if (item_01 != (cJSON *)0x0) {
    cJSON_Delete(item_01);
  }
  return 0;
}

Assistant:

static cJSON_bool parse_object(cJSON * const item, parse_buffer * const input_buffer)
{
    cJSON *head = NULL; /* linked list head */
    cJSON *current_item = NULL;

    if (input_buffer->depth >= CJSON_NESTING_LIMIT)
    {
        return false; /* to deeply nested */
    }
    input_buffer->depth++;

    if (cannot_access_at_index(input_buffer, 0) || (buffer_at_offset(input_buffer)[0] != '{'))
    {
        goto fail; /* not an object */
    }

    input_buffer->offset++;
    buffer_skip_whitespace(input_buffer);
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '}'))
    {
        goto success; /* empty object */
    }

    /* check if we skipped to the end of the buffer */
    if (cannot_access_at_index(input_buffer, 0))
    {
        input_buffer->offset--;
        goto fail;
    }

    /* step back to character in front of the first element */
    input_buffer->offset--;
    /* loop through the comma separated array elements */
    do
    {
        /* allocate next item */
        cJSON *new_item = cJSON_New_Item(&(input_buffer->hooks));
        if (new_item == NULL)
        {
            goto fail; /* allocation failure */
        }

        /* attach next item to list */
        if (head == NULL)
        {
            /* start the linked list */
            current_item = head = new_item;
        }
        else
        {
            /* add to the end and advance */
            current_item->next = new_item;
            new_item->prev = current_item;
            current_item = new_item;
        }

        if (cannot_access_at_index(input_buffer, 1))
        {
            goto fail; /* nothing comes after the comma */
        }

        /* parse the name of the child */
        input_buffer->offset++;
        buffer_skip_whitespace(input_buffer);
        if (!parse_string(current_item, input_buffer))
        {
            goto fail; /* failed to parse name */
        }
        buffer_skip_whitespace(input_buffer);

        /* swap valuestring and string, because we parsed the name */
        current_item->string = current_item->valuestring;
        current_item->valuestring = NULL;

        if (cannot_access_at_index(input_buffer, 0) || (buffer_at_offset(input_buffer)[0] != ':'))
        {
            goto fail; /* invalid object */
        }

        /* parse the value */
        input_buffer->offset++;
        buffer_skip_whitespace(input_buffer);
        if (!parse_value(current_item, input_buffer))
        {
            goto fail; /* failed to parse value */
        }
        buffer_skip_whitespace(input_buffer);
    }
    while (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == ','));

    if (cannot_access_at_index(input_buffer, 0) || (buffer_at_offset(input_buffer)[0] != '}'))
    {
        goto fail; /* expected end of object */
    }

success:
    input_buffer->depth--;

    if (head != NULL) {
        head->prev = current_item;
    }

    item->type = cJSON_Object;
    item->child = head;

    input_buffer->offset++;
    return true;

fail:
    if (head != NULL)
    {
        cJSON_Delete(head);
    }

    return false;
}